

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjTable::do_all_post_load_init(CVmObjTable *this)

{
  pli_enum_ctx ctx;
  undefined8 local_18;
  
  local_18 = 0;
  CVmHashTable::enum_entries(this->post_load_init_table_,pli_status_cb,&local_18);
  CVmHashTable::enum_entries(this->post_load_init_table_,pli_invoke_cb,&local_18);
  return;
}

Assistant:

void CVmObjTable::do_all_post_load_init(VMG0_)
{
    pli_enum_ctx ctx;

    /* set up our context */
    ctx.globals = VMGLOB_ADDR;

    /* first, mark all entries as having status 'uninitialized' */
    post_load_init_table_->enum_entries(&pli_status_cb, &ctx);

    /* next, invoke the initializer method for each entry */
    post_load_init_table_->enum_entries(&pli_invoke_cb, &ctx);
}